

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STL_set.cpp
# Opt level: O2

void FindPeople(void)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  bool bVar3;
  istream *piVar4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr *pp_Var6;
  ostream *poVar7;
  people *ppVar8;
  people *extraout_RDX;
  people *extraout_RDX_00;
  people *extraout_RDX_01;
  int j;
  _Rb_tree_node_base *p_Var9;
  char *pcVar10;
  int i;
  int iVar11;
  _Base_ptr p_Var12;
  undefined1 auVar13 [16];
  int age;
  int w;
  int h;
  people local_74;
  int m;
  int n;
  set<people,_std::less<people>,_std::allocator<people>_> s;
  
  piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,&n);
  std::istream::operator>>(piVar4,&m);
  p_Var1 = &s._M_t._M_impl.super__Rb_tree_header;
  s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar11 = 0;
  s._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  s._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  do {
    if (n <= iVar11) {
      for (iVar11 = 0; iVar11 < m; iVar11 = iVar11 + 1) {
        piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,&h);
        piVar4 = (istream *)std::istream::operator>>(piVar4,&w);
        std::istream::operator>>(piVar4,&age);
        ppVar8 = (people *)(ulong)(uint)age;
        local_74.h = h;
        local_74.w = w;
        local_74.age = age;
        pp_Var6 = &s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var12 = &p_Var1->_M_header;
        while (p_Var2 = *pp_Var6, (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0) {
          bVar3 = std::less<people>::operator()((less<people> *)(p_Var2 + 1),&local_74,ppVar8);
          if (!bVar3) {
            p_Var12 = p_Var2;
          }
          ppVar8 = extraout_RDX_01;
          pp_Var6 = &p_Var2->_M_left + bVar3;
        }
        if ((_Rb_tree_header *)p_Var12 == p_Var1) {
          pcVar10 = "NO";
        }
        else {
          bVar3 = std::less<people>::operator()
                            ((less<people> *)&local_74,
                             (people *)&((_Rb_tree_header *)p_Var12)->_M_node_count,ppVar8);
          pcVar10 = "YES";
          if (bVar3) {
            pcVar10 = "NO";
          }
        }
        poVar7 = std::operator<<((ostream *)&std::cout,pcVar10);
        std::endl<char,std::char_traits<char>>(poVar7);
      }
      std::set<people,_std::less<people>,_std::allocator<people>_>::~set(&s);
      return;
    }
    piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,&h);
    piVar4 = (istream *)std::istream::operator>>(piVar4,&w);
    std::istream::operator>>(piVar4,&age);
    ppVar8 = (people *)(ulong)(uint)age;
    local_74.h = h;
    local_74.w = w;
    local_74.age = age;
    bVar3 = true;
    pp_Var6 = &s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var9 = &p_Var1->_M_header;
    while( true ) {
      auVar13._8_8_ = ppVar8;
      auVar13._0_8_ = p_Var9;
      p_Var5 = *pp_Var6;
      if (p_Var5 == (_Rb_tree_node_base *)0x0) break;
      bVar3 = std::less<people>::operator()((less<people> *)&local_74,(people *)(p_Var5 + 1),ppVar8)
      ;
      pp_Var6 = &p_Var5->_M_left + !bVar3;
      ppVar8 = extraout_RDX;
      p_Var9 = p_Var5;
    }
    if (bVar3 == false) {
LAB_0010170c:
      bVar3 = std::less<people>::operator()
                        ((less<people> *)(auVar13._0_8_ + 0x20),&local_74,auVar13._8_8_);
      ppVar8 = extraout_RDX_00;
      if (bVar3) goto LAB_0010171c;
    }
    else {
      if (p_Var9 != s._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
        auVar13 = std::_Rb_tree_decrement(p_Var9);
        goto LAB_0010170c;
      }
LAB_0010171c:
      if (p_Var1 == (_Rb_tree_header *)p_Var9) {
        bVar3 = true;
      }
      else {
        bVar3 = std::less<people>::operator()
                          ((less<people> *)&local_74,(people *)(p_Var9 + 1),ppVar8);
      }
      p_Var5 = (_Rb_tree_node_base *)operator_new(0x30);
      *(int *)&p_Var5[1]._M_parent = local_74.age;
      *(ulong *)(p_Var5 + 1) = CONCAT44(local_74.w,local_74.h);
      std::_Rb_tree_insert_and_rebalance(bVar3,p_Var5,p_Var9,&p_Var1->_M_header);
      s._M_t._M_impl.super__Rb_tree_header._M_node_count =
           s._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
    }
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

void FindPeople() {
    struct people{
        int h;
        int w;
        int age;
        //自定义构造函数，来代替people.h 等的输入，直接调用people(h,w,age)传入h,w,age
        people(int _h,int _w, int _age)
        {
            h = _h;
            w = _w;
            age = _age;
        }
        //重载 "<"
        bool operator <(const people &rhs) const
        {
            if (h != rhs.h)
                return h < rhs.h;
            if (w != rhs.w)
                return w < rhs.w;
            return age < rhs.age;
        }
    };
    int n,m,h,w,age;
    cin >> n >> m;
    set<people> s;
    for (int i = 0; i < n; ++i) {
        cin >> h >> w >> age;
        s.insert(people(h,w,age));
    }
    for (int j = 0; j < m; ++j) {
        cin >> h >> w >> age;
        if(s.count(people(h,w,age)))
            cout << "YES" << endl;
        else
            cout << "NO" << endl;
    }
}